

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::CuePoint::Write(CuePoint *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  int extraout_var;
  int extraout_var_00;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  if ((this->track_ != 0) && (this->cluster_pos_ != 0)) {
    uVar4 = EbmlElementSize(0xf1,this->cluster_pos_);
    uVar5 = EbmlElementSize(0xf7,this->track_);
    uVar5 = uVar5 + uVar4;
    if ((this->output_block_number_ == true) && (1 < this->block_number_)) {
      uVar4 = EbmlElementSize(0x5378,this->block_number_);
      uVar5 = uVar5 + uVar4;
    }
    uVar4 = EbmlMasterElementSize(0xb7,uVar5);
    uVar6 = EbmlElementSize(0xb3,this->time_);
    uVar4 = uVar6 + uVar5 + uVar4;
    bVar1 = WriteEbmlMasterElement(writer,0xbb,uVar4);
    if (bVar1) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (((((-1 < extraout_var) && (bVar1 = WriteEbmlElement(writer,0xb3,this->time_), bVar1)) &&
           (bVar1 = WriteEbmlMasterElement(writer,0xb7,uVar5), bVar1)) &&
          ((bVar1 = WriteEbmlElement(writer,0xf7,this->track_), bVar1 &&
           (bVar1 = WriteEbmlElement(writer,0xf1,this->cluster_pos_), bVar1)))) &&
         ((this->output_block_number_ != true ||
          ((this->block_number_ < 2 ||
           (bVar1 = WriteEbmlElement(writer,0x5378,this->block_number_), bVar1)))))) {
        iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
        if (-1 < extraout_var_00) {
          return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar4;
        }
      }
    }
  }
  return false;
}

Assistant:

bool CuePoint::Write(IMkvWriter* writer) const {
  if (!writer || track_ < 1 || cluster_pos_ < 1)
    return false;

  uint64_t size = EbmlElementSize(libwebm::kMkvCueClusterPosition,
                                  static_cast<uint64>(cluster_pos_));
  size += EbmlElementSize(libwebm::kMkvCueTrack, static_cast<uint64>(track_));
  if (output_block_number_ && block_number_ > 1)
    size += EbmlElementSize(libwebm::kMkvCueBlockNumber,
                            static_cast<uint64>(block_number_));
  const uint64_t track_pos_size =
      EbmlMasterElementSize(libwebm::kMkvCueTrackPositions, size) + size;
  const uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvCueTime, static_cast<uint64>(time_)) +
      track_pos_size;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvCuePoint, payload_size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvCueTime,
                        static_cast<uint64>(time_))) {
    return false;
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvCueTrackPositions, size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvCueTrack,
                        static_cast<uint64>(track_))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvCueClusterPosition,
                        static_cast<uint64>(cluster_pos_))) {
    return false;
  }
  if (output_block_number_ && block_number_ > 1) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCueBlockNumber,
                          static_cast<uint64>(block_number_))) {
      return false;
    }
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0)
    return false;

  if (stop_position - payload_position != static_cast<int64_t>(payload_size))
    return false;

  return true;
}